

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O1

void __thiscall
MlPotassiumChannel::MlPotassiumChannel
          (MlPotassiumChannel *this,double weight,double reversal,string *name,string *type)

{
  pointer pcVar1;
  undefined1 local_f8 [104];
  string local_90;
  string local_70;
  string local_50;
  
  StochasticProcess::StochasticProcess((StochasticProcess *)this,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__MlPotassiumChannel_0015d9d8;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlPotassiumChannel_0015da88;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__MlPotassiumChannel_0015dad0;
  pcVar1 = local_f8 + 0x10;
  local_f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Differential Equation","");
  DifferentialEquation::DifferentialEquation(&this->potassNt,(string *)local_f8,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"m","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"V","");
  Unit::Unit((Unit *)local_f8,&local_70,&local_90);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,(Unit *)local_f8);
  Unit::~Unit((Unit *)local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"reversal-potential","");
  Parametric::addParameter((Parametric *)this,(string *)local_f8);
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  local_f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"weight","");
  Parametric::addParameter((Parametric *)this,(string *)local_f8);
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  return;
}

Assistant:

MlPotassiumChannel::MlPotassiumChannel(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}